

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_DeflateZLIB(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  uint uVar1;
  ktx_error_code_e kVar2;
  uchar *pDest;
  ktx_size_t kVar3;
  ktx_size_t *__ptr;
  uchar *pSrc;
  void *__dest;
  long in_RDI;
  ktx_error_code_e result;
  size_t levelByteLengthCmp;
  int32_t level_1;
  int32_t level;
  ktx_uint8_t *pCmpDst;
  ktxLevelIndexEntry *nindex;
  ktxLevelIndexEntry *cindex;
  ktx_size_t levelOffset;
  ktx_size_t byteLengthCmp;
  ktx_size_t dstRemainingByteLength;
  ktx_uint8_t *cmpData;
  ktx_uint8_t *workBuf;
  ktx_uint32_t levelIndexByteLength;
  int iVar4;
  int iVar5;
  ktx_size_t *pDestLength;
  ktx_size_t local_40;
  size_t local_38;
  ktx_size_t local_30;
  ktx_error_code_e local_4;
  
  uVar1 = *(int *)(in_RDI + 0x34) * 0x18;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  pDest = (uchar *)(*(long *)(in_RDI + 0xa0) + 0x20);
  if (*(int *)(in_RDI + 0x88) == 0) {
    iVar5 = *(int *)(in_RDI + 0x34);
    while (iVar5 = iVar5 + -1, -1 < iVar5) {
      kVar3 = ktxCompressZLIBBounds(0x541fc8);
      local_30 = kVar3 + local_30;
    }
    __ptr = (ktx_size_t *)malloc(local_30 + uVar1);
    if (__ptr == (ktx_size_t *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      pSrc = (uchar *)((long)__ptr + (ulong)uVar1);
      iVar4 = *(int *)(in_RDI + 0x34);
      pDestLength = __ptr;
      while (iVar4 = iVar4 + -1, -1 < iVar4) {
        kVar3 = local_30;
        kVar2 = ktxCompressZLIBInt(pDest,pDestLength,pSrc,CONCAT44(iVar5,iVar4),
                                   (ktx_uint32_t)(local_30 >> 0x20));
        if (kVar2 != KTX_SUCCESS) {
          free(__ptr);
          return kVar2;
        }
        pDestLength[(long)iVar4 * 3] = local_40;
        pDestLength[(long)iVar4 * 3 + 2] = *(ktx_size_t *)(pDest + (long)iVar4 * 0x18 + 8);
        pDestLength[(long)iVar4 * 3 + 1] = kVar3;
        local_38 = kVar3 + local_38;
        local_40 = kVar3 + local_40;
        local_30 = local_30 - kVar3;
      }
      __dest = malloc(local_38);
      if (__dest == (void *)0x0) {
        free(__ptr);
        local_4 = KTX_OUT_OF_MEMORY;
      }
      else {
        memcpy(__dest,pSrc,local_38);
        memcpy(pDest,pDestLength,(ulong)uVar1);
        free(__ptr);
        free(*(void **)(in_RDI + 0x70));
        *(void **)(in_RDI + 0x70) = __dest;
        *(size_t *)(in_RDI + 0x68) = local_38;
        *(undefined4 *)(in_RDI + 0x88) = 3;
        *(undefined4 *)(*(long *)(in_RDI + 0xa0) + 8) = 1;
        local_4 = KTX_SUCCESS;
      }
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZLIB(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // mz_deflateBound provides a conservative size to account for that.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ktxCompressZLIBBounds(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL)
        return KTX_OUT_OF_MEMORY;
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp = dstRemainingByteLength;
        KTX_error_code result = ktxCompressZLIBInt(pCmpDst + levelOffset,
                                                    &levelByteLengthCmp,
                                                    &This->pData[cindex[level].byteOffset],
                                                    cindex[level].byteLength,
                                                    compressionLevel);
        if (result != KTX_SUCCESS) {
            free(workBuf);
            return result;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZLIB;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;
}